

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O1

TextureFormat vk::getDepthCopyFormat(VkFormat combinedFormat)

{
  TextureFormat TVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0x12;
  switch(combinedFormat) {
  case VK_FORMAT_D16_UNORM:
  case VK_FORMAT_X8_D24_UNORM_PACK32:
  case VK_FORMAT_D32_SFLOAT:
    TVar1 = mapVkFormat(combinedFormat);
    uVar2 = (ulong)TVar1 & 0xffffffff00000000;
    uVar3 = (ulong)TVar1 & 0xffffffff;
    break;
  default:
    uVar3 = 0x15;
    uVar2 = 0x2600000000;
    break;
  case VK_FORMAT_D16_UNORM_S8_UINT:
    uVar2 = 0x400000000;
    break;
  case VK_FORMAT_D24_UNORM_S8_UINT:
    uVar2 = 0x1a00000000;
    break;
  case VK_FORMAT_D32_SFLOAT_S8_UINT:
    uVar2 = 0x2300000000;
  }
  return (TextureFormat)(uVar2 | uVar3);
}

Assistant:

tcu::TextureFormat getDepthCopyFormat (VkFormat combinedFormat)
{
	switch (combinedFormat)
	{
		case VK_FORMAT_D16_UNORM:
		case VK_FORMAT_X8_D24_UNORM_PACK32:
		case VK_FORMAT_D32_SFLOAT:
			return mapVkFormat(combinedFormat);

		case VK_FORMAT_D16_UNORM_S8_UINT:
			return mapVkFormat(VK_FORMAT_D16_UNORM);
		case VK_FORMAT_D24_UNORM_S8_UINT:
			return mapVkFormat(VK_FORMAT_X8_D24_UNORM_PACK32);
		case VK_FORMAT_D32_SFLOAT_S8_UINT:
			return mapVkFormat(VK_FORMAT_D32_SFLOAT);

		case VK_FORMAT_S8_UINT:
		default:
			DE_FATAL("Unexpected depth/stencil format");
			return tcu::TextureFormat();
	}
}